

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O3

void __thiscall dgMeshEffect::SphericalMapping(dgMeshEffect *this,HaI32 material)

{
  undefined8 uVar1;
  int iVar2;
  dgTreeNode *this_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  ulong uVar5;
  undefined1 auVar6 [16];
  dgRedBackNode *pdVar7;
  dgBigVector *pdVar8;
  dgVertexAtribute *pdVar9;
  undefined1 auVar12 [16];
  long lVar10;
  long lVar11;
  undefined1 auVar13 [32];
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  double dVar18;
  undefined1 auVar20 [32];
  dgStack<dgMeshEffect::dgVertexAtribute> attribArray;
  dgStack<dgBigVector> sphere;
  dgBigVector origin;
  dgStack<dgMeshEffect::dgVertexAtribute> local_b8;
  double local_a8;
  dgStack<dgBigVector> local_a0;
  double local_90;
  Iterator local_88;
  double local_78;
  double dStack_70;
  undefined1 local_68 [16];
  dgBigVector local_50;
  
  GetOrigin(&local_50,this);
  iVar2 = *(int *)&(this->super_dgRefCounter).field_0xc;
  local_a0.super_dgStackBase.m_ptr = malloc((long)(iVar2 << 5));
  local_a0.m_size = iVar2;
  if (0 < iVar2) {
    lVar10 = 0;
    lVar11 = 0;
    local_90 = local_50.super_dgTemplateVector<double>.m_x;
    local_78 = local_50.super_dgTemplateVector<double>.m_y;
    dStack_70 = local_50.super_dgTemplateVector<double>.m_z;
    do {
      pdVar8 = this->m_points;
      uVar1 = *(undefined8 *)((long)&(pdVar8->super_dgTemplateVector<double>).m_w + lVar10);
      auVar20._8_8_ = uVar1;
      auVar20._0_8_ = uVar1;
      auVar20._16_8_ = uVar1;
      auVar20._24_8_ = uVar1;
      dVar15 = *(double *)((long)&(pdVar8->super_dgTemplateVector<double>).m_x + lVar10) - local_90;
      auVar12._8_8_ = dStack_70;
      auVar12._0_8_ = local_78;
      auVar12 = vsubpd_avx(*(undefined1 (*) [16])
                            ((long)&(pdVar8->super_dgTemplateVector<double>).m_y + lVar10),auVar12);
      auVar4 = vpermpd_avx2(ZEXT1632(auVar12),0xd0);
      auVar4 = vblendpd_avx(auVar4,ZEXT832((ulong)dVar15),1);
      auVar4 = vblendpd_avx(auVar4,auVar20,8);
      auVar13._8_8_ = 0x7fffffffffffffff;
      auVar13._0_8_ = 0x7fffffffffffffff;
      auVar13._16_8_ = 0x7fffffffffffffff;
      auVar13._24_8_ = 0x7fffffffffffffff;
      auVar13 = vandpd_avx512vl(auVar4,auVar13);
      auVar4._8_8_ = 0x7fefffffffffffff;
      auVar4._0_8_ = 0x7fefffffffffffff;
      auVar4._16_8_ = 0x7fefffffffffffff;
      auVar4._24_8_ = 0x7fefffffffffffff;
      uVar5 = vpcmpgtq_avx512vl(auVar13,auVar4);
      if ((uVar5 & 0xf) != 0) {
LAB_008649ac:
        __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                      ,0x145,"dgBigVector::dgBigVector(const dgTemplateVector<hacd::HaF64> &)");
      }
      dVar14 = auVar12._0_8_;
      auVar3 = vshufpd_avx(auVar12,auVar12,1);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = dVar15;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = dVar14 * dVar14;
      auVar17 = vfmadd231sd_fma(auVar19,auVar17,auVar17);
      auVar3 = vfmadd213sd_fma(auVar3,auVar3,auVar17);
      auVar3 = vsqrtsd_avx(auVar3,auVar3);
      dVar18 = (double)(1.0 / (float)auVar3._0_8_);
      if (0x7fefffffffffffff < (long)ABS(dVar15 * dVar18)) goto LAB_008649ac;
      auVar16._0_8_ = dVar14 * dVar18;
      auVar16._8_8_ = auVar12._8_8_ * dVar18;
      auVar3._8_8_ = 0x7fffffffffffffff;
      auVar3._0_8_ = 0x7fffffffffffffff;
      auVar12 = vandpd_avx512vl(auVar16,auVar3);
      auVar6._8_8_ = 0x7fefffffffffffff;
      auVar6._0_8_ = 0x7fefffffffffffff;
      uVar5 = vpcmpgtq_avx512vl(auVar12,auVar6);
      if (((uVar5 & 1) != 0) || ((uVar5 & 3) >> 1 != 0)) goto LAB_008649ac;
      local_68 = auVar16;
      dVar14 = asin(auVar16._0_8_);
      local_a8 = 1.5707999467849731 - (double)(float)dVar14;
      auVar12 = vpermilpd_avx(local_68,1);
      dVar15 = atan2(dVar15 * dVar18,auVar12._0_8_);
      dVar14 = local_a8 / 3.1415998935699463;
      local_a8 = (3.1415998935699463 - (double)(float)dVar15) / 6.283199787139893;
      pdVar8 = dgStack<dgBigVector>::operator[](&local_a0,(HaI32)lVar11);
      (pdVar8->super_dgTemplateVector<double>).m_x = local_a8;
      pdVar8 = dgStack<dgBigVector>::operator[](&local_a0,(HaI32)lVar11);
      lVar11 = lVar11 + 1;
      lVar10 = lVar10 + 0x20;
      (pdVar8->super_dgTemplateVector<double>).m_y = dVar14;
    } while (lVar11 < *(int *)&(this->super_dgRefCounter).field_0xc);
  }
  iVar2 = (this->super_dgPolyhedra).super_dgTree<dgEdge,_long>.m_count;
  local_b8.super_dgStackBase.m_ptr = malloc((long)(iVar2 * 0x60));
  local_b8.m_size = iVar2;
  if (-1 < iVar2) {
    EnumerateAttributeArray(this,(dgVertexAtribute *)local_b8.super_dgStackBase.m_ptr);
    this_00 = (this->super_dgPolyhedra).super_dgTree<dgEdge,_long>.m_head;
    local_88.m_tree = (dgTree<dgEdge,_long> *)this;
    if (this_00 == (dgTreeNode *)0x0) {
      local_88.m_ptr = (dgRedBackNode *)0x0;
    }
    else {
      local_88.m_ptr = dgRedBackNode::Minimum(&this_00->super_dgRedBackNode);
    }
    if (local_88.m_ptr != (dgRedBackNode *)0x0) {
      do {
        pdVar7 = local_88.m_ptr;
        pdVar9 = dgStack<dgMeshEffect::dgVertexAtribute>::operator[]
                           (&local_b8,*(HaI32 *)&local_88.m_ptr[1].m_left);
        pdVar8 = dgStack<dgBigVector>::operator[]
                           (&local_a0,*(HaI32 *)&pdVar7[1]._vptr_dgRedBackNode);
        pdVar9->m_u0 = (HaF64)(pdVar8->super_dgTemplateVector<double>).m_x;
        pdVar8 = dgStack<dgBigVector>::operator[]
                           (&local_a0,*(HaI32 *)&pdVar7[1]._vptr_dgRedBackNode);
        pdVar9->m_v0 = (HaF64)(pdVar8->super_dgTemplateVector<double>).m_y;
        pdVar8 = dgStack<dgBigVector>::operator[]
                           (&local_a0,*(HaI32 *)&pdVar7[1]._vptr_dgRedBackNode);
        pdVar9->m_u1 = (HaF64)(pdVar8->super_dgTemplateVector<double>).m_x;
        pdVar8 = dgStack<dgBigVector>::operator[]
                           (&local_a0,*(HaI32 *)&pdVar7[1]._vptr_dgRedBackNode);
        pdVar9->m_v1 = (HaF64)(pdVar8->super_dgTemplateVector<double>).m_y;
        pdVar9->m_material = (HaF64)(double)material;
        dgTree<dgEdge,_long>::Iterator::operator++(&local_88,0);
      } while (local_88.m_ptr != (dgRedBackNode *)0x0);
    }
    if (-1 < local_b8.m_size) {
      FixCylindricalMapping(this,(dgVertexAtribute *)local_b8.super_dgStackBase.m_ptr);
      if (-1 < local_b8.m_size) {
        ApplyAttributeArray(this,(dgVertexAtribute *)local_b8.super_dgStackBase.m_ptr);
        free(local_b8.super_dgStackBase.m_ptr);
        free(local_a0.super_dgStackBase.m_ptr);
        return;
      }
    }
  }
  __assert_fail("(entry < m_size) || ((m_size == 0) && (entry == 0))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgStack.h"
                ,0x60,
                "T &dgStack<dgMeshEffect::dgVertexAtribute>::operator[](hacd::HaI32) [T = dgMeshEffect::dgVertexAtribute]"
               );
}

Assistant:

void dgMeshEffect::SphericalMapping (hacd::HaI32 material)
{
	dgBigVector origin (GetOrigin());

	dgStack<dgBigVector>sphere (m_pointCount);
	for (hacd::HaI32 i = 0; i < m_pointCount; i ++) {
		dgBigVector point (m_points[i] - origin);
		point = point.Scale (1.0f / dgSqrt (point % point));

		hacd::HaF64 u = dgAsin (point.m_y);
		hacd::HaF64 v = dgAtan2 (point.m_x, point.m_z);

		u = (hacd::HaF64 (3.1416f/2.0f) - u) / hacd::HaF64 (3.1416f);
		v = (hacd::HaF64 (3.1416f) - v) / hacd::HaF64 (2.0f * 3.1416f);
		sphere[i].m_x = v;
		sphere[i].m_y = u;
	}


	dgStack<dgVertexAtribute>attribArray (GetCount());
	EnumerateAttributeArray (&attribArray[0]);

	dgPolyhedra::Iterator iter (*this);	
	for(iter.Begin(); iter; iter ++){
		dgEdge* const edge = &(*iter);
		dgVertexAtribute& attrib = attribArray[hacd::HaI32 (edge->m_userData)];
		attrib.m_u0 = sphere[edge->m_incidentVertex].m_x;
		attrib.m_v0 = sphere[edge->m_incidentVertex].m_y;
		attrib.m_u1 = sphere[edge->m_incidentVertex].m_x;
		attrib.m_v1 = sphere[edge->m_incidentVertex].m_y;
		attrib.m_material = material;
	}

	FixCylindricalMapping (&attribArray[0]);
	ApplyAttributeArray (&attribArray[0]);
}